

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cxx
# Opt level: O1

ptr<snapshot> __thiscall cornerstone::snapshot::deserialize(snapshot *this,buffer *buf)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ptr<snapshot> pVar2;
  ptr<cluster_config> conf;
  ulong size;
  ulong last_log_term;
  ulong last_log_idx;
  undefined1 local_59;
  cluster_config local_58;
  
  local_58.servers_.
  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ._M_impl._M_node._M_size = buffer::get_ulong(buf);
  local_58.servers_.
  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)buffer::get_ulong(buf);
  local_58.servers_.
  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)buffer::get_ulong(buf);
  cluster_config::deserialize(&local_58,buf);
  this->last_log_idx_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cornerstone::snapshot,std::allocator<cornerstone::snapshot>,unsigned_long&,unsigned_long&,std::shared_ptr<cornerstone::cluster_config>&,unsigned_long&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->last_log_term_,(snapshot **)this,
             (allocator<cornerstone::snapshot> *)&local_59,
             &local_58.servers_.
              super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
              ._M_impl._M_node._M_size,
             (unsigned_long *)
             ((long)&local_58.servers_.
                     super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                     ._M_impl._M_node.super__List_node_base + 8),
             (shared_ptr<cornerstone::cluster_config> *)&local_58,
             (unsigned_long *)&local_58.servers_);
  _Var1._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.prev_log_idx_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.prev_log_idx_);
    _Var1._M_pi = extraout_RDX_00;
  }
  pVar2.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  pVar2.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<snapshot>)pVar2.super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot> snapshot::deserialize(buffer& buf)
{
    ulong last_log_idx = buf.get_ulong();
    ulong last_log_term = buf.get_ulong();
    ulong size = buf.get_ulong();
    ptr<cluster_config> conf(cluster_config::deserialize(buf));
    return cs_new<snapshot>(last_log_idx, last_log_term, conf, size);
}